

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O0

void __thiscall JUnitTestOutput::~JUnitTestOutput(JUnitTestOutput *this)

{
  JUnitTestOutputImpl *this_00;
  JUnitTestOutput *this_local;
  
  (this->super_TestOutput)._vptr_TestOutput = (_func_int **)&PTR__JUnitTestOutput_001894f8;
  resetTestGroupResult(this);
  this_00 = this->impl_;
  if (this_00 != (JUnitTestOutputImpl *)0x0) {
    JUnitTestOutputImpl::~JUnitTestOutputImpl(this_00);
    operator_delete(this_00,0x70);
  }
  TestOutput::~TestOutput(&this->super_TestOutput);
  return;
}

Assistant:

JUnitTestOutput::~JUnitTestOutput()
{
    resetTestGroupResult();
    delete impl_;
}